

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hdr_histogram_log.c
# Opt level: O1

int apply_to_counts(hdr_histogram *h,int32_t word_size,uint8_t *counts_data,int32_t counts_limit)

{
  uint uVar1;
  ulong uVar2;
  int iVar3;
  uint *puVar4;
  ulong uVar5;
  
  puVar4 = &switchD_001062cf::switchdataD_001071ec;
  switch(word_size) {
  case 1:
    iVar3 = apply_to_counts_zz(h,counts_data,counts_limit);
    return iVar3;
  case 2:
    if (0 < counts_limit) {
      puVar4 = (uint *)h->counts;
      uVar5 = 0;
      do {
        *(ulong *)(puVar4 + uVar5 * 2) =
             (ulong)(ushort)(*(ushort *)(counts_data + uVar5 * 2) << 8 |
                            *(ushort *)(counts_data + uVar5 * 2) >> 8);
        uVar5 = uVar5 + 1;
      } while ((uint)counts_limit != uVar5);
    }
    break;
  case 4:
    if (0 < counts_limit) {
      puVar4 = (uint *)h->counts;
      uVar5 = 0;
      do {
        uVar1 = *(uint *)(counts_data + uVar5 * 4);
        *(ulong *)(puVar4 + uVar5 * 2) =
             (ulong)(uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18
                    );
        uVar5 = uVar5 + 1;
      } while ((uint)counts_limit != uVar5);
    }
    break;
  case 8:
    if (0 < counts_limit) {
      puVar4 = (uint *)h->counts;
      uVar5 = 0;
      do {
        uVar2 = *(ulong *)(counts_data + uVar5 * 8);
        *(ulong *)(puVar4 + uVar5 * 2) =
             uVar2 >> 0x38 | (uVar2 & 0xff000000000000) >> 0x28 | (uVar2 & 0xff0000000000) >> 0x18 |
             (uVar2 & 0xff00000000) >> 8 | (uVar2 & 0xff000000) << 8 | (uVar2 & 0xff0000) << 0x18 |
             (uVar2 & 0xff00) << 0x28 | uVar2 << 0x38;
        uVar5 = uVar5 + 1;
      } while ((uint)counts_limit != uVar5);
    }
  }
  return (int)puVar4;
}

Assistant:

static int apply_to_counts(
    struct hdr_histogram* h, const int32_t word_size, const uint8_t* counts_data, const int32_t counts_limit)
{
    switch (word_size)
    {
        case 2:
            apply_to_counts_16(h, (const int16_t*) counts_data, counts_limit);
            return 0;

        case 4:
            apply_to_counts_32(h, (const int32_t*) counts_data, counts_limit);
            return 0;

        case 8:
            apply_to_counts_64(h, (const int64_t*) counts_data, counts_limit);
            return 0;

        case 1:
            return apply_to_counts_zz(h, counts_data, counts_limit);

        default:
            return -1;
    }
}